

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

void * __thiscall dgMeshEffect::GetNextVertex(dgMeshEffect *this,void *vertex)

{
  int iVar1;
  dgRedBackNode *pdVar2;
  Iterator local_20;
  
  iVar1 = *(int *)((long)vertex + 0x50);
  local_20.m_ptr = (dgRedBackNode *)vertex;
  local_20.m_tree = (dgTree<dgEdge,_long> *)this;
  dgTree<dgEdge,_long>::Iterator::operator++(&local_20,0);
  if (local_20.m_ptr != (dgRedBackNode *)0x0) {
    do {
      if (*(int *)&local_20.m_ptr[2]._vptr_dgRedBackNode != iVar1) {
        pdVar2 = local_20.m_ptr + 1;
        do {
          *(int *)&pdVar2[1]._vptr_dgRedBackNode = iVar1;
          pdVar2 = *(dgRedBackNode **)(*(long *)&pdVar2->field_0x20 + 0x10);
        } while (pdVar2 != local_20.m_ptr + 1);
        return local_20.m_ptr;
      }
      dgTree<dgEdge,_long>::Iterator::operator++(&local_20,0);
    } while (local_20.m_ptr != (dgRedBackNode *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void* dgMeshEffect::GetNextVertex (const void* const vertex)
{
	dgTreeNode* node = (dgTreeNode*) vertex;
	hacd::HaI32 mark = node->GetInfo().m_mark;

	Iterator iter (*this);
	iter.Set (node);
	for (iter ++; iter; iter ++) {
		dgTreeNode* node = iter.GetNode();
		if (node->GetInfo().m_mark != mark) {
			dgEdge* const edge = &node->GetInfo();
			dgEdge* ptr = edge;
			do {
				ptr->m_mark = mark;
				ptr = ptr->m_twin->m_next;
			} while (ptr != edge);
			return node; 
		}
	}
	return NULL; 
}